

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

void ourWriteOutJSON(writeoutvar *mappings,CURL *curl,per_transfer *per,FILE *stream)

{
  CURLINFO ci;
  char *key;
  undefined8 uVar1;
  int local_48;
  int ok;
  CURLINFO cinfo;
  char *name;
  writeoutvar *wovar;
  int i;
  FILE *stream_local;
  per_transfer *per_local;
  CURL *curl_local;
  writeoutvar *mappings_local;
  
  fputs("{",(FILE *)stream);
  wovar._4_4_ = 0;
  while (mappings[wovar._4_4_].name != (char *)0x0) {
    key = mappings[wovar._4_4_].name;
    ci = mappings[wovar._4_4_].cinfo;
    local_48 = 0;
    if (mappings[wovar._4_4_].is_ctrl != 1) {
      switch(mappings[wovar._4_4_].jsontype) {
      case JSON_STRING:
        local_48 = writeString(stream,curl,key,ci);
        break;
      case JSON_LONG:
        local_48 = writeLong(stream,curl,key,ci,per,mappings + wovar._4_4_);
        break;
      case JSON_OFFSET:
        local_48 = writeOffset(stream,curl,key,ci);
        break;
      case JSON_TIME:
        local_48 = writeTime(stream,curl,key,ci);
        break;
      case JSON_VERSION:
        local_48 = writeVersion(stream,curl,key,ci);
        break;
      case JSON_FILENAME:
        local_48 = writeFilename(stream,key,(per->outs).filename);
      }
      if (local_48 != 0) {
        fputs(",",(FILE *)stream);
      }
    }
    wovar._4_4_ = wovar._4_4_ + 1;
  }
  uVar1 = curl_version();
  curl_mfprintf(stream,"\"curl_version\":\"%s\"}",uVar1);
  return;
}

Assistant:

void ourWriteOutJSON(const struct writeoutvar mappings[], CURL *curl,
                     struct per_transfer *per, FILE *stream)
{
  int i;

  fputs("{", stream);
  for(i = 0; mappings[i].name != NULL; i++) {
    const struct writeoutvar *wovar = &mappings[i];
    const char *name = mappings[i].name;
    CURLINFO cinfo = mappings[i].cinfo;
    int ok = 0;

    if(mappings[i].is_ctrl == 1) {
      continue;
    }

    switch(mappings[i].jsontype) {
    case JSON_STRING:
      ok = writeString(stream, curl, name, cinfo);
      break;
    case JSON_LONG:
      ok = writeLong(stream, curl, name, cinfo, per, wovar);
      break;
    case JSON_OFFSET:
      ok = writeOffset(stream, curl, name, cinfo);
      break;
    case JSON_TIME:
      ok = writeTime(stream, curl, name, cinfo);
      break;
    case JSON_FILENAME:
      ok = writeFilename(stream, name, per->outs.filename);
      break;
    case JSON_VERSION:
      ok = writeVersion(stream, curl, name, cinfo);
      break;
    default:
      break;
    }

    if(ok) {
      fputs(",", stream);
    }
  }

  fprintf(stream, "\"curl_version\":\"%s\"}", curl_version());
}